

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprVectorRegister(Parse *pParse,Expr *pVector,int iField,int regSelect,Expr **ppExpr,
                      int *pRegFree)

{
  Expr *pEVar1;
  u8 op;
  int *pRegFree_local;
  Expr **ppExpr_local;
  int regSelect_local;
  int iField_local;
  Expr *pVector_local;
  Parse *pParse_local;
  
  if (pVector->op == 0x9d) {
    pEVar1 = sqlite3VectorFieldSubexpr(pVector,iField);
    *ppExpr = pEVar1;
    pParse_local._4_4_ = pVector->iTable + iField;
  }
  else if (pVector->op == 'w') {
    *ppExpr = ((pVector->x).pSelect)->pEList->a[iField].pExpr;
    pParse_local._4_4_ = regSelect + iField;
  }
  else {
    *ppExpr = ((pVector->x).pList)->a[iField].pExpr;
    pParse_local._4_4_ = sqlite3ExprCodeTemp(pParse,*ppExpr,pRegFree);
  }
  return pParse_local._4_4_;
}

Assistant:

static int exprVectorRegister(
  Parse *pParse,                  /* Parse context */
  Expr *pVector,                  /* Vector to extract element from */
  int iField,                     /* Field to extract from pVector */
  int regSelect,                  /* First in array of registers */
  Expr **ppExpr,                  /* OUT: Expression element */
  int *pRegFree                   /* OUT: Temp register to free */
){
  u8 op = pVector->op;
  assert( op==TK_VECTOR || op==TK_REGISTER || op==TK_SELECT );
  if( op==TK_REGISTER ){
    *ppExpr = sqlite3VectorFieldSubexpr(pVector, iField);
    return pVector->iTable+iField;
  }
  if( op==TK_SELECT ){
    *ppExpr = pVector->x.pSelect->pEList->a[iField].pExpr;
     return regSelect+iField;
  }
  *ppExpr = pVector->x.pList->a[iField].pExpr;
  return sqlite3ExprCodeTemp(pParse, *ppExpr, pRegFree);
}